

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

int chol(double *A,int N)

{
  int iVar1;
  
  if (N < 0x41) {
    iVar1 = cholu(A,N);
    return iVar1;
  }
  iVar1 = bcholu(A,N);
  return iVar1;
}

Assistant:

int chol(double *A, int N) {
	int sc;
	if ( N <= (int) BLOCKSIZE) {
		sc = cholu(A,N);
	} else {
		sc = bcholu(A,N);
	}
	return sc;
}